

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

void hollow_out_room(chunk_conflict *c,loc grid)

{
  loc_conflict grid_00;
  square_conflict *psVar1;
  loc grid1;
  wchar_t d;
  chunk_conflict *c_local;
  loc grid_local;
  
  for (grid1.x = 0; grid1.x < 9; grid1.x = grid1.x + 1) {
    grid_00 = (loc_conflict)loc_sum(grid,ddgrid_ddd[grid1.x]);
    psVar1 = square((chunk *)c,grid_00);
    if ((uint)psVar1->feat == FEAT_MAGMA) {
      square_set_feat((chunk *)c,grid_00,FEAT_FLOOR);
      hollow_out_room(c,(loc)grid_00);
    }
    else {
      psVar1 = square((chunk *)c,grid_00);
      if ((uint)psVar1->feat == FEAT_OPEN) {
        square_set_feat((chunk *)c,grid_00,FEAT_BROKEN);
        hollow_out_room(c,(loc)grid_00);
      }
    }
  }
  return;
}

Assistant:

static void hollow_out_room(struct chunk *c, struct loc grid)
{
	int d;

	for (d = 0; d < 9; d++) {
		/* Extract adjacent location */
		struct loc grid1 = loc_sum(grid, ddgrid_ddd[d]);

		/* Change magma to floor. */
		if (square(c, grid1)->feat == FEAT_MAGMA) {
			square_set_feat(c, grid1, FEAT_FLOOR);

			/* Hollow out the room. */
			hollow_out_room(c, grid1);
		}
		/* Change open door to broken door. */
		else if (square(c, grid1)->feat == FEAT_OPEN) {
			square_set_feat(c, grid1, FEAT_BROKEN);

			/* Hollow out the (new) room. */
			hollow_out_room(c, grid1);
		}
	}
}